

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall MutableS2ShapeIndex::Encode(MutableS2ShapeIndex *this,Encoder *encoder)

{
  bool bVar1;
  int iVar2;
  size_type __n;
  S2ShapeIndexCell *this_00;
  Encoder *encoder_00;
  Encoder *in_RCX;
  Span<const_S2CellId> v;
  s2coding *local_d8;
  pointer local_d0;
  value_type local_c8;
  undefined1 local_c0 [8];
  Iterator it;
  StringVectorEncoder encoded_cells;
  undefined1 local_38 [8];
  vector<S2CellId,_std::allocator<S2CellId>_> cell_ids;
  uint64 max_edges;
  Encoder *encoder_local;
  MutableS2ShapeIndex *this_local;
  
  Encoder::Ensure(encoder,10);
  iVar2 = Options::max_edges_per_cell(&this->options_);
  cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(long)iVar2;
  Encoder::put_varint64
            (encoder,(long)cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage << 2);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_38);
  __n = gtl::internal_btree::
        btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
        ::size((btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
                *)&this->cell_map_);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::reserve
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_38,__n);
  s2coding::StringVectorEncoder::StringVectorEncoder((StringVectorEncoder *)&it.end_.position);
  Iterator::Iterator((Iterator *)local_c0,this,BEGIN);
  while( true ) {
    bVar1 = S2ShapeIndex::IteratorBase::done((IteratorBase *)local_c0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_c8.id_ = (uint64)S2ShapeIndex::IteratorBase::id((IteratorBase *)local_c0);
    std::vector<S2CellId,_std::allocator<S2CellId>_>::push_back
              ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_38,&local_c8);
    this_00 = Iterator::cell((Iterator *)local_c0);
    iVar2 = num_shape_ids(this);
    encoder_00 = s2coding::StringVectorEncoder::AddViaEncoder
                           ((StringVectorEncoder *)&it.end_.position);
    S2ShapeIndexCell::Encode(this_00,iVar2,encoder_00);
    Iterator::Next((Iterator *)local_c0);
  }
  Iterator::~Iterator((Iterator *)local_c0);
  absl::Span<S2CellId_const>::
  Span<std::vector<S2CellId,std::allocator<S2CellId>>,void,std::vector<S2CellId,std::allocator<S2CellId>>>
            ((Span<S2CellId_const> *)&local_d8,
             (vector<S2CellId,_std::allocator<S2CellId>_> *)local_38);
  v.len_ = (size_type)encoder;
  v.ptr_ = local_d0;
  s2coding::EncodeS2CellIdVector(local_d8,v,in_RCX);
  s2coding::StringVectorEncoder::Encode((StringVectorEncoder *)&it.end_.position,encoder);
  s2coding::StringVectorEncoder::~StringVectorEncoder((StringVectorEncoder *)&it.end_.position);
  std::vector<S2CellId,_std::allocator<S2CellId>_>::~vector
            ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_38);
  return;
}

Assistant:

void MutableS2ShapeIndex::Encode(Encoder* encoder) const {
  // The version number is encoded in 2 bits, under the assumption that by the
  // time we need 5 versions the first version can be permanently retired.
  // This only saves 1 byte, but that's significant for very small indexes.
  encoder->Ensure(Varint::kMax64);
  uint64 max_edges = options_.max_edges_per_cell();
  encoder->put_varint64(max_edges << 2 | kCurrentEncodingVersionNumber);

  vector<S2CellId> cell_ids;
  cell_ids.reserve(cell_map_.size());
  s2coding::StringVectorEncoder encoded_cells;
  for (Iterator it(this, S2ShapeIndex::BEGIN); !it.done(); it.Next()) {
    cell_ids.push_back(it.id());
    it.cell().Encode(num_shape_ids(), encoded_cells.AddViaEncoder());
  }
  s2coding::EncodeS2CellIdVector(cell_ids, encoder);
  encoded_cells.Encode(encoder);
}